

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.hxx
# Opt level: O0

void __thiscall
vigra::ContractViolation::ContractViolation
          (ContractViolation *this,char *prefix,char *message,char *file,int line)

{
  exception *in_RDI;
  char (*in_stack_00000128) [3];
  ContractViolation *in_stack_00000130;
  
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__ContractViolation_001bea08;
  std::__cxx11::string::string((string *)(in_RDI + 8));
  operator<<(in_stack_00000130,(char (*) [2])in_stack_00000128);
  operator<<(in_stack_00000130,(char **)in_stack_00000128);
  operator<<(in_stack_00000130,(char (*) [2])in_stack_00000128);
  operator<<(in_stack_00000130,(char **)in_stack_00000128);
  operator<<(in_stack_00000130,in_stack_00000128);
  operator<<(in_stack_00000130,(char **)in_stack_00000128);
  operator<<(in_stack_00000130,(char (*) [2])in_stack_00000128);
  operator<<(in_stack_00000130,(int *)in_stack_00000128);
  operator<<(in_stack_00000130,in_stack_00000128);
  return;
}

Assistant:

ContractViolation(char const * prefix, char const * message,
                      char const * file, int line)
    {
        (*this) << "\n" << prefix << "\n" << message << "\n("
                 << file << ":" << line << ")\n";
    }